

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parseurl(char *url,CURLU *u,uint flags)

{
  CURLUcode CVar1;
  CURLUcode result;
  uint flags_local;
  CURLU *u_local;
  char *url_local;
  
  CVar1 = seturl(url,u,flags);
  if (CVar1 != CURLUE_OK) {
    free_urlhandle(u);
    memset(u,0,0x60);
  }
  return CVar1;
}

Assistant:

static CURLUcode parseurl(const char *url, CURLU *u, unsigned int flags)
{
  CURLUcode result = seturl(url, u, flags);
  if(result) {
    free_urlhandle(u);
    memset(u, 0, sizeof(struct Curl_URL));
  }
  return result;
}